

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_line.hpp
# Opt level: O0

void __thiscall Args::CmdLine::addArg(CmdLine *this,ArgPtr *arg)

{
  bool bVar1;
  char *__rhs;
  pointer pAVar2;
  __normal_iterator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_*,_std::vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>_>
  in_RSI;
  __normal_iterator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_*,_std::vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>_>
  in_RDI;
  vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
  *in_stack_ffffffffffffff08;
  vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
  *in_stack_ffffffffffffff10;
  unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *in_stack_ffffffffffffff18;
  allocator *__lhs;
  undefined1 local_c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  allocator local_91;
  string local_90 [96];
  unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *local_30;
  unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *local_28;
  unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *local_20;
  unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *local_18;
  
  local_20 = (unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)
             std::
             vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
             ::begin(in_stack_ffffffffffffff08);
  local_28 = (unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)
             std::
             vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
             ::end(in_stack_ffffffffffffff08);
  local_18 = (unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)
             std::
             find<__gnu_cxx::__normal_iterator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>*,std::vector<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,std::allocator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>>>>,std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>>
                       (in_RDI,in_RSI,in_stack_ffffffffffffff18);
  local_30 = (unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)
             std::
             vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
             ::end(in_stack_ffffffffffffff08);
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_*,_std::vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>_>
                      *)in_stack_ffffffffffffff10,
                     (__normal_iterator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_*,_std::vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>_>
                      *)in_stack_ffffffffffffff08);
  if (!bVar1) {
    __rhs = (char *)__cxa_allocate_exception(0x30);
    __lhs = &local_91;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"Argument \"",__lhs);
    pAVar2 = std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>::operator->
                       ((unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)
                        0x14989b);
    (*pAVar2->_vptr_ArgIface[3])(local_c8);
    std::operator+(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,__rhs)
    ;
    BaseException::BaseException((BaseException *)in_RSI._M_current,(String *)__lhs);
    __cxa_throw(__rhs,&BaseException::typeinfo,BaseException::~BaseException);
  }
  pAVar2 = std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>::operator->
                     ((unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)
                      0x14982d);
  (*pAVar2->_vptr_ArgIface[0x12])(pAVar2,in_RDI._M_current);
  std::
  vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
  ::push_back(in_stack_ffffffffffffff10,(value_type *)in_stack_ffffffffffffff08);
  return;
}

Assistant:

void addArg( ArgPtr arg )
	{
		if( std::find( m_args.begin(), m_args.end(), arg ) ==
			m_args.end() )
		{
			arg->setCmdLine( this );

			m_args.push_back( std::move( arg ) );
		}
		else
			throw BaseException( String( SL( "Argument \"" ) ) +
				arg->name() + SL( "\" already in the command line parser." ) );
	}